

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::GetFullNameInternal
          (cmTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *__lhs;
  uint uVar6;
  string *psVar7;
  string ll;
  string fw_prefix;
  allocator local_e9;
  char *local_e8;
  uint local_dc;
  string local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  uint local_64;
  char *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  if (MODULE_LIBRARY < this->TargetTypeValue) {
    std::__cxx11::string::assign((char *)outPrefix);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::assign((char *)outSuffix);
    return;
  }
  local_b8 = config;
  local_70 = outPrefix;
  if (implib) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&local_d8,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator *)&local_b0);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    psVar7 = local_b8;
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::assign((char *)local_70);
      std::__cxx11::string::assign((char *)outBase);
      std::__cxx11::string::assign((char *)outSuffix);
      return;
    }
    if ((this->TargetTypeValue & ~STATIC_LIBRARY) != SHARED_LIBRARY) {
      implib = this->TargetTypeValue == EXECUTABLE && implib;
    }
    if (implib != false) {
      std::__cxx11::string::string((string *)&local_d8,"IMPORT_PREFIX",(allocator *)&local_b0);
      pcVar3 = GetProperty(this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::string((string *)&local_d8,"IMPORT_SUFFIX",(allocator *)&local_b0);
      local_e8 = GetProperty(this,&local_d8);
      uVar4 = std::__cxx11::string::~string((string *)&local_d8);
      local_dc = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
      goto LAB_002c4ae2;
    }
  }
  psVar7 = local_b8;
  std::__cxx11::string::string((string *)&local_d8,"PREFIX",(allocator *)&local_b0);
  pcVar3 = GetProperty(this,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"SUFFIX",(allocator *)&local_b0);
  local_e8 = GetProperty(this,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_dc = 0;
LAB_002c4ae2:
  local_38 = outBase;
  if (psVar7->_M_string_length == 0) {
    local_60 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_d8,psVar7);
    std::__cxx11::string::append((char *)&local_d8);
    pcVar5 = GetProperty(this,&local_d8);
    if (((pcVar5 == (char *)0x0) || (bVar2 = IsAppBundleOnApple(this), bVar2)) ||
       (bVar2 = IsFrameworkOnApple(this), bVar2)) {
      pcVar5 = (char *)0x0;
    }
    local_60 = pcVar5;
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar2 = local_dc._0_1_;
  uVar6 = local_dc & 0xff;
  pcVar5 = GetPrefixVariableInternal(this,local_dc._0_1_);
  local_64 = uVar6;
  __lhs = GetSuffixVariableInternal(this,bVar2);
  GetLinkerLanguage(&local_d8,this,local_b8);
  if (local_d8._M_string_length != 0) {
    if (__lhs != (char *)0x0 && local_e8 == (char *)0x0) {
      if (*__lhs == '\0') {
        local_e8 = (char *)0x0;
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"_",&local_e9);
        std::operator+(&local_90,__lhs,&local_58);
        std::operator+(&local_b0,&local_90,&local_d8);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_58);
        local_e8 = cmMakefile::GetDefinition(this->Makefile,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    if (pcVar5 != (char *)0x0 && pcVar3 == (char *)0x0) {
      if (*pcVar5 == '\0') {
        pcVar3 = (char *)0x0;
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"_",&local_e9);
        std::operator+(&local_90,pcVar5,&local_58);
        std::operator+(&local_b0,&local_90,&local_d8);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_58);
        pcVar3 = cmMakefile::GetDefinition(this->Makefile,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
  }
  if ((pcVar5 != (char *)0x0) && (pcVar3 == (char *)0x0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_b0,pcVar5,(allocator *)&local_90);
    cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  psVar7 = local_70;
  if ((__lhs != (char *)0x0) && (local_e8 == (char *)0x0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_b0,__lhs,(allocator *)&local_90);
    local_e8 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  bVar2 = IsFrameworkOnApple(this);
  if (bVar2) {
    GetOutputName(&local_90,this,local_b8,false);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)&local_b0);
    local_e8 = (char *)0x0;
  }
  bVar2 = IsCFBundleOnApple(this);
  if (bVar2) {
    GetCFBundleDirectory(&local_90,this,local_b8,false);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)&local_b0);
    local_e8 = (char *)0x0;
  }
  std::__cxx11::string::assign((char *)psVar7);
  GetOutputName(&local_90,this,local_b8,SUB41(local_64,0));
  psVar7 = local_38;
  std::__cxx11::string::append((string *)local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::append((char *)psVar7);
  std::__cxx11::string::string((string *)&local_90,"SOVERSION",(allocator *)&local_58);
  pcVar3 = GetProperty(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((pcVar3 != (char *)0x0) && ((char)local_dc == '\0' && this->TargetTypeValue == SHARED_LIBRARY)
     ) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&local_90,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",(allocator *)&local_58);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar2) {
      std::__cxx11::string::append((char *)psVar7);
      std::__cxx11::string::append((char *)psVar7);
    }
  }
  std::__cxx11::string::assign((char *)outSuffix);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void cmTarget::GetFullNameInternal(const std::string& config,
                                   bool implib,
                                   std::string& outPrefix,
                                   std::string& outBase,
                                   std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmTarget::STATIC_LIBRARY &&
     this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmTarget::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}